

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

BOOL __thiscall Js::JavascriptRegExp::IsEnumerable(JavascriptRegExp *this,PropertyId propertyId)

{
  bool bVar1;
  BOOL BVar2;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  BOOL local_48;
  BOOL local_44;
  BOOL local_40;
  BOOL local_3c;
  ScriptConfiguration *scriptConfig;
  PropertyId propertyId_local;
  JavascriptRegExp *this_local;
  
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_01 = ScriptContext::GetConfig(this_00);
  if ((propertyId != 0x153) && (propertyId != 0x1a0)) {
    if (propertyId == 0x1a2) {
      return 0;
    }
    if (propertyId != 0x1a3) {
      if (propertyId == 0x1a4) {
        bVar1 = ScriptConfiguration::IsES2018RegExDotAllEnabled(this_01);
        if ((!bVar1) ||
           (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_01), bVar1)) {
          local_44 = DynamicObject::IsEnumerable(&this->super_DynamicObject,0x1a4);
        }
        else {
          local_44 = 0;
        }
        return local_44;
      }
      if (propertyId != 0x1a5) {
        if (propertyId == 0x1a6) {
          bVar1 = ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_01);
          if ((!bVar1) ||
             (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_01), bVar1)) {
            local_40 = DynamicObject::IsEnumerable(&this->super_DynamicObject,0x1a6);
          }
          else {
            local_40 = 0;
          }
          return local_40;
        }
        if (propertyId == 0x1a7) {
          bVar1 = ScriptConfiguration::IsES6RegExStickyEnabled(this_01);
          if ((!bVar1) ||
             (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_01), bVar1)) {
            local_48 = DynamicObject::IsEnumerable(&this->super_DynamicObject,0x1a7);
          }
          else {
            local_48 = 0;
          }
          return local_48;
        }
        if (propertyId != 0x1e0) {
          BVar2 = DynamicObject::IsEnumerable(&this->super_DynamicObject,propertyId);
          return BVar2;
        }
      }
    }
  }
  bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_01);
  if (bVar1) {
    local_3c = DynamicObject::IsEnumerable(&this->super_DynamicObject,propertyId);
  }
  else {
    local_3c = 0;
  }
  return local_3c;
}

Assistant:

BOOL JavascriptRegExp::IsEnumerable(PropertyId propertyId)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define IS_ENUMERABLE(ownProperty) \
        return (ownProperty ? false : DynamicObject::IsEnumerable(propertyId));

        switch (propertyId)
        {
        case PropertyIds::lastIndex:
            return false;
        case PropertyIds::global:
        case PropertyIds::multiline:
        case PropertyIds::ignoreCase:
        case PropertyIds::source:
        case PropertyIds::options:
            IS_ENUMERABLE(!scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::unicode:
            IS_ENUMERABLE(scriptConfig->IsES6UnicodeExtensionsEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::dotAll:
            IS_ENUMERABLE(scriptConfig->IsES2018RegExDotAllEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::sticky:
            IS_ENUMERABLE(scriptConfig->IsES6RegExStickyEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        default:
            return DynamicObject::IsEnumerable(propertyId);
        }

#undef IS_ENUMERABLE
    }